

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

_Bool script_is_op_n(uchar op,_Bool allow_zero,size_t *n)

{
  size_t *n_local;
  _Bool allow_zero_local;
  uchar op_local;
  
  if ((allow_zero) && (op == '\0')) {
    if (n != (size_t *)0x0) {
      *n = 0;
    }
    n_local._7_1_ = true;
  }
  else if ((op < 0x51) || (0x60 < op)) {
    n_local._7_1_ = false;
  }
  else {
    if (n != (size_t *)0x0) {
      *n = (long)(int)(op - 0x50);
    }
    n_local._7_1_ = true;
  }
  return n_local._7_1_;
}

Assistant:

bool script_is_op_n(unsigned char op, bool allow_zero, size_t *n) {
    if (allow_zero && op == OP_0) {
        if (n)
            *n = 0;
        return true;
    }
    if (op >= OP_1 && op <= OP_16) {
        if (n)
            *n = op - OP_1 + 1;
        return true;
    }
    return false;
}